

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_remove(lua_State *L,TString *ts)

{
  global_State *pgVar1;
  anon_union_8_2_b887aad4_for_u *local_28;
  TString **p;
  stringtable *tb;
  TString *ts_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  for (local_28 = (anon_union_8_2_b887aad4_for_u *)
                  ((pgVar1->strt).hash + (int)(ts->hash & (pgVar1->strt).size - 1U));
      (TString *)local_28->lnglen != ts; local_28 = &local_28->hnext->u) {
  }
  *local_28 = local_28->hnext->u;
  (pgVar1->strt).nuse = (pgVar1->strt).nuse + -1;
  return;
}

Assistant:

void luaS_remove(lua_State *L, TString *ts) {
    stringtable *tb = &G(L)->strt;
    TString **p = &tb->hash[lmod(ts->hash, tb->size)];
    while (*p != ts)  /* find previous element */
        p = &(*p)->u.hnext;
    *p = (*p)->u.hnext;  /* remove element from its list */
    tb->nuse--;
}